

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

void Dau_DsdNormalize_rec(char *pStr,char **p,int *pMatches)

{
  int iVar1;
  byte *pbVar2;
  char *pDest;
  int iVar3;
  byte bVar4;
  int *piVar5;
  uint uVar6;
  byte *pbVar7;
  long lVar8;
  bool bVar9;
  int local_68 [14];
  
  pbVar2 = (byte *)*p;
  do {
    if (*pbVar2 != 0x21) goto LAB_003eeeb7;
    do {
      pbVar2 = pbVar2 + 1;
      *p = (char *)pbVar2;
LAB_003eeeb7:
      bVar4 = *pbVar2;
    } while ((byte)(bVar4 - 0x30) < 10 || (byte)(bVar4 + 0xbf) < 6);
    if (bVar4 == 0x3c) {
      bVar4 = 0x3c;
      if (pStr[(long)pMatches[(long)pbVar2 - (long)pStr] + 1] == '{') {
        pbVar2 = (byte *)(pStr + (long)pMatches[(long)pbVar2 - (long)pStr] + 1);
        *p = (char *)pbVar2;
        bVar4 = *pbVar2;
        goto LAB_003eeef8;
      }
    }
    else {
LAB_003eeef8:
      if ((byte)(bVar4 + 0x9f) < 0x1a) {
        return;
      }
      if ((bVar4 != 0x3c) && (uVar6 = (uint)bVar4, uVar6 != 0x7b)) {
        if ((uVar6 != 0x5b) && (uVar6 != 0x28)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                        ,0x102,"void Dau_DsdNormalize_rec(char *, char **, int *)");
        }
        iVar1 = pMatches[(long)pbVar2 - (long)pStr];
        if (uVar6 + (bVar4 != 0x28) + 1 != (int)pStr[iVar1]) {
          __assert_fail("*q == **p + 1 + (**p != \'(\')",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                        ,0xe1,"void Dau_DsdNormalize_rec(char *, char **, int *)");
        }
        pbVar7 = pbVar2 + 1;
        lVar8 = 0;
        while( true ) {
          pbVar2 = pbVar2 + 1;
          *p = (char *)pbVar2;
          iVar3 = (int)pbVar2 - (int)pStr;
          if (pStr + iVar1 <= pbVar2) break;
          local_68[lVar8] = iVar3;
          lVar8 = lVar8 + 1;
          Dau_DsdNormalize_rec(pStr,p,pMatches);
          pbVar2 = (byte *)*p;
        }
        local_68[lVar8] = iVar3;
        if (pbVar2 == (byte *)(pStr + iVar1)) {
          Dau_DsdNormalizePerm(pStr,local_68,(int)lVar8);
          pDest = Dau_DsdNormalize_rec::pBuffer;
          piVar5 = Dau_DsdNormalizePerm::pPerm;
          while (bVar9 = lVar8 != 0, lVar8 = lVar8 + -1, bVar9) {
            pDest = Dau_DsdNormalizeCopy(pDest,pStr,local_68,*piVar5);
            piVar5 = piVar5 + 1;
          }
          if (pDest + -0xb28950 == *p + -(long)pbVar7) {
            memcpy(pbVar7,Dau_DsdNormalize_rec::pBuffer,(size_t)(pDest + -0xb28950));
            return;
          }
          __assert_fail("pStore - pBuffer == *p - pOld",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                        ,0xef,"void Dau_DsdNormalize_rec(char *, char **, int *)");
        }
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                      ,0xe8,"void Dau_DsdNormalize_rec(char *, char **, int *)");
      }
    }
    if (bVar4 + 2 != (int)pStr[pMatches[(long)pbVar2 - (long)pStr]]) {
      __assert_fail("*q == **p + 1 + (**p != \'(\')",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                    ,0xf6,"void Dau_DsdNormalize_rec(char *, char **, int *)");
    }
    pbVar7 = (byte *)(pStr + pMatches[(long)pbVar2 - (long)pStr]);
    if ((bVar4 != 0x3c) || (pbVar7[1] != 0x7b)) {
      while( true ) {
        pbVar2 = pbVar2 + 1;
        *p = (char *)pbVar2;
        if (pbVar7 <= pbVar2) break;
        Dau_DsdNormalize_rec(pStr,p,pMatches);
        pbVar2 = (byte *)*p;
      }
      if (pbVar2 == pbVar7) {
        return;
      }
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                    ,0xff,"void Dau_DsdNormalize_rec(char *, char **, int *)");
    }
    pbVar2 = pbVar7 + 1;
    *p = (char *)pbVar2;
  } while( true );
}

Assistant:

void Dau_DsdNormalize_rec( char * pStr, char ** p, int * pMatches )
{
    static char pBuffer[DAU_MAX_STR];
    if ( **p == '!' )
        (*p)++;
    while ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
        (*p)++;
    if ( **p == '<' )
    {
        char * q = pStr + pMatches[*p - pStr];
        if ( *(q+1) == '{' )
            *p = q+1;
    }
    if ( **p >= 'a' && **p <= 'z' ) // var
        return;
    if ( **p == '(' || **p == '[' ) // and/or/xor
    {
        char * pStore, * pOld = *p + 1;
        char * q = pStr + pMatches[ *p - pStr ];
        int i, * pPerm, nMarks = 0, pMarks[DAU_MAX_VAR+1];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
        {
            pMarks[nMarks++] = *p - pStr;
            Dau_DsdNormalize_rec( pStr, p, pMatches );
        }
        pMarks[nMarks] = *p - pStr;
        assert( *p == q );
        // add to buffer in good order
        pPerm = Dau_DsdNormalizePerm( pStr, pMarks, nMarks );
        // copy to the buffer
        pStore = pBuffer;
        for ( i = 0; i < nMarks; i++ )
            pStore = Dau_DsdNormalizeCopy( pStore, pStr, pMarks, pPerm[i] );
        assert( pStore - pBuffer == *p - pOld );
        memcpy( pOld, pBuffer, pStore - pBuffer );
        return;
    }
    if ( **p == '<' || **p == '{' ) // mux
    {
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        if ( (**p == '<') && (*(q+1) == '{') )
        {
            *p = q+1;
            Dau_DsdNormalize_rec( pStr, p, pMatches );
            return;
        }
        for ( (*p)++; *p < q; (*p)++ )
            Dau_DsdNormalize_rec( pStr, p, pMatches );
        assert( *p == q );
        return;
    }
    assert( 0 );
}